

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOutStream.h
# Opt level: O0

void __thiscall UnitTest::MemoryOutStream::~MemoryOutStream(MemoryOutStream *this,void **vtt)

{
  void **vtt_local;
  MemoryOutStream *this_local;
  
  (this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
       = (_func_int **)*vtt;
  *(void **)((long)&(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream +
            (long)(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]) = vtt[5];
  std::__cxx11::string::~string
            ((string *)
             &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x70);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

~MemoryOutStream() {}